

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# denoted.c
# Opt level: O0

Denoted * get_denoted_typedef(Denoted_Base *base)

{
  Denoted *pDVar1;
  Denoted_Typedef *ret;
  Denoted_Base *base_local;
  
  pDVar1 = (Denoted *)malloc(0x18);
  pDVar1->denotation = DT_Typedef;
  *(Type **)(pDVar1 + 4) = base->type;
  *(token **)(pDVar1 + 2) = base->id;
  return pDVar1;
}

Assistant:

struct Denoted* get_denoted_typedef(struct Denoted_Base *base)
{
	struct Denoted_Typedef *ret;
	ret=malloc(sizeof(struct Denoted_Typedef));
	ret->denotation=DT_Typedef;
	ret->type=base->type;
	ret->id=base->id;

	return (struct Denoted*)ret;

}